

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O3

ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_> * __thiscall
mp::pre::ValuePresolverImpl::
RunPresolve<mp::pre::ModelValues<mp::pre::ValueMap<std::vector<int,std::allocator<int>>,int>>>
          (ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_>
           *__return_storage_ptr__,ValuePresolverImpl *this,LinkFn fn,
          ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_> *mv,
          ValueResolution vr)

{
  _Elt_pointer pLVar1;
  code *pcVar2;
  LinkRange *br;
  _Hash_node_base *p_Var3;
  _Elt_pointer pLVar4;
  _Elt_pointer pLVar5;
  long *plVar6;
  undefined4 in_register_00000084;
  undefined4 in_R9D;
  _Map_pointer ppLVar7;
  
  for (p_Var3 = (this->val_nodes_)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    ValueNode::CleanUpAndRealloc((ValueNode *)p_Var3[1]._M_nxt);
  }
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>::operator=
            ((ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>> *)
             &this->src_,
             (ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_> *)
             CONCAT44(in_register_00000084,vr));
  pLVar4 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pLVar1 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar4 != pLVar1) {
    pLVar5 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
             super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppLVar7 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
              super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      plVar6 = (long *)((long)&pLVar4->b_->_vptr_BasicLink + (long)&(mv->name_)._M_dataplus);
      pcVar2 = (code *)fn;
      if ((fn & 1) != 0) {
        pcVar2 = *(code **)(*plVar6 + -1 + fn);
      }
      (*pcVar2)(plVar6,pLVar4->ir_,in_R9D);
      pLVar4 = pLVar4 + 1;
      if (pLVar4 == pLVar5) {
        pLVar4 = ppLVar7[1];
        ppLVar7 = ppLVar7 + 1;
        pLVar5 = pLVar4 + 0x20;
      }
    } while (pLVar4 != pLVar1);
  }
  ModelValues<mp::pre::ValueMap<std::vector<int,std::allocator<int>>,int>>::
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>
            ((ModelValues<mp::pre::ValueMap<std::vector<int,std::allocator<int>>,int>> *)
             __return_storage_ptr__,&this->dest_);
  return __return_storage_ptr__;
}

Assistant:

ModelValues RunPresolve(LinkFn fn, const ModelValues& mv,
                          ValueResolution vr) const {
    CleanUpValueNodes();
    src_ = mv;
    for (const auto& br: brl_)
      (br.b_.*fn)(br.ir_, vr);
    return dest_;
  }